

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

type cm::operator==(StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,char **r)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  type tVar3;
  size_type __rlen;
  string local_40;
  
  StringOpPlus::operator_cast_to_string(&local_40,(StringOpPlus *)l);
  __s = *r;
  sVar2 = strlen(__s);
  if (local_40._M_string_length == sVar2) {
    if (local_40._M_string_length != 0) {
      iVar1 = bcmp(local_40._M_dataplus._M_p,__s,local_40._M_string_length);
      if (iVar1 != 0) goto LAB_001cf38a;
    }
    tVar3 = true;
  }
  else {
LAB_001cf38a:
    tVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return tVar3;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}